

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O1

void __thiscall amrex::STLtools::prepare(STLtools *this)

{
  XDim3 *pXVar1;
  XDim3 *d;
  ostringstream *this_00;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  size_type sVar5;
  pointer pTVar6;
  pointer pTVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  byte bVar10;
  int iVar11;
  double *pdVar12;
  int iVar13;
  double *pdVar14;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_EDX_01;
  uint uVar15;
  long lVar16;
  byte bVar17;
  bool bVar18;
  Real *pRVar19;
  ulong uVar20;
  ulong uVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  gpu_tuple_element<5UL,_double> gVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar38;
  undefined1 auVar37 [16];
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  undefined8 uVar48;
  double dVar49;
  double dVar50;
  undefined8 uVar51;
  double dVar52;
  Real RVar53;
  undefined1 auVar54 [16];
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  double dVar58;
  double dVar59;
  undefined1 auVar60 [16];
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  ReduceOps<amrex::ReduceOpMin,_amrex::ReduceOpMin,_amrex::ReduceOpMin,_amrex::ReduceOpMax,_amrex::ReduceOpMax,_amrex::ReduceOpMax>
  reduce_op;
  ReduceData<double,_double,_double,_double,_double,_double> reduce_data;
  ReduceOps<amrex::ReduceOpMin,_amrex::ReduceOpMin,_amrex::ReduceOpMin,_amrex::ReduceOpMax,_amrex::ReduceOpMax,_amrex::ReduceOpMax>
  local_599;
  double local_598;
  undefined8 uStack_590;
  double local_580;
  undefined1 local_578 [16];
  double local_568;
  double dStack_560;
  double local_558;
  double dStack_550;
  undefined1 local_548 [16];
  undefined1 local_538 [16];
  double local_528;
  ulong uStack_520;
  undefined1 local_518 [16];
  double local_508;
  undefined8 uStack_500;
  undefined1 local_4f8 [16];
  double local_4e8;
  double dStack_4e0;
  double local_4d8;
  undefined8 uStack_4d0;
  undefined1 local_4c8 [16];
  double local_4b8;
  double dStack_4b0;
  double local_4a8;
  ulong uStack_4a0;
  double local_498;
  double dStack_490;
  double local_488;
  undefined8 uStack_480;
  double local_478;
  undefined8 uStack_470;
  double local_468;
  double dStack_460;
  undefined1 local_458 [16];
  double local_448;
  undefined8 uStack_440;
  double local_438;
  ulong uStack_430;
  double local_428;
  undefined8 uStack_420;
  double local_410;
  double local_408;
  double local_400;
  double local_3f8;
  double dStack_3f0;
  double local_3e8;
  double dStack_3e0;
  double local_3d8;
  ulong uStack_3d0;
  double local_3c8;
  double dStack_3c0;
  double local_3b8;
  undefined8 uStack_3b0;
  undefined1 local_3a8 [16];
  double local_398;
  double dStack_390;
  undefined1 local_388 [16];
  double local_378;
  double dStack_370;
  double local_368;
  double dStack_360;
  double local_358;
  STLtools *local_350;
  double local_348;
  ulong uStack_340;
  double local_338;
  ulong uStack_330;
  ReduceData<double,_double,_double,_double,_double,_double> local_320;
  double local_2e8;
  ulong uStack_2e0;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  ulong uStack_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  double local_288;
  double dStack_280;
  double local_278;
  double dStack_270;
  double local_268;
  double dStack_260;
  double local_258;
  double dStack_250;
  double local_248;
  double dStack_240;
  double local_238;
  double dStack_230;
  double local_228;
  double dStack_220;
  double local_218;
  undefined8 uStack_210;
  double local_208;
  undefined8 uStack_200;
  double local_1f8;
  undefined8 uStack_1f0;
  Type local_1e8;
  undefined1 local_1b8 [24];
  undefined8 auStack_1a0 [46];
  
  if (*(int *)(ParallelContext::frames + 0xc) != 0) {
    PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::resize
              (&this->m_tri_pts_h,(long)this->m_num_tri);
  }
  PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::resize
            (&this->m_tri_pts_d,(long)this->m_num_tri);
  PODVector<amrex::XDim3,_std::allocator<amrex::XDim3>_>::resize
            (&this->m_tri_normals_d,(long)this->m_num_tri);
  sVar5 = (this->m_tri_pts_h).m_size;
  if (sVar5 != 0) {
    memcpy((this->m_tri_pts_d).m_data,(this->m_tri_pts_h).m_data,sVar5 * 0x48);
  }
  pTVar6 = (this->m_tri_pts_d).m_data;
  iVar11 = this->m_num_tri;
  if (0 < (long)iVar11) {
    pRVar19 = &((this->m_tri_normals_d).m_data)->z;
    lVar16 = 0;
    do {
      auVar4._8_8_ = *(double *)((long)&(pTVar6->v2).x + lVar16);
      pdVar12 = (double *)((long)&(pTVar6->v2).y + lVar16);
      dVar39 = *pdVar12;
      dVar43 = pdVar12[1];
      dVar27 = *(double *)((long)&(pTVar6->v3).y + lVar16) - dVar39;
      dVar52 = auVar4._8_8_ - *(double *)((long)&(pTVar6->v1).x + lVar16);
      pdVar12 = (double *)((long)&(pTVar6->v1).y + lVar16);
      dVar39 = dVar39 - *pdVar12;
      dVar40 = dVar43 - pdVar12[1];
      dVar43 = *(double *)((long)&(pTVar6->v3).z + lVar16) - dVar43;
      auVar4._8_8_ = *(double *)((long)&(pTVar6->v3).x + lVar16) - auVar4._8_8_;
      dVar33 = dVar39 * dVar43 - dVar27 * dVar40;
      dVar43 = dVar40 * auVar4._8_8_ - dVar43 * dVar52;
      auVar4._8_8_ = dVar52 * dVar27 - auVar4._8_8_ * dVar39;
      dVar39 = auVar4._8_8_ * auVar4._8_8_ + dVar33 * dVar33 + dVar43 * dVar43;
      if (dVar39 < 0.0) {
        uStack_590 = 0;
        local_598 = auVar4._8_8_;
        local_568 = dVar33;
        dStack_560 = dVar43;
        dVar39 = sqrt(dVar39);
        auVar4._8_8_ = local_598;
        dVar33 = local_568;
        dVar43 = dStack_560;
      }
      else {
        dVar39 = SQRT(dVar39);
      }
      dVar39 = 1.0 / dVar39;
      ((XDim3 *)(pRVar19 + -2))->x = dVar33 * dVar39;
      pRVar19[-1] = dVar43 * dVar39;
      *pRVar19 = auVar4._8_8_ * dVar39;
      lVar16 = lVar16 + 0x48;
      pRVar19 = pRVar19 + 3;
    } while ((long)iVar11 * 0x48 != lVar16);
  }
  ReduceData<double,double,double,double,double,double>::
  ReduceData<amrex::ReduceOpMin,amrex::ReduceOpMin,amrex::ReduceOpMin,amrex::ReduceOpMax,amrex::ReduceOpMax,amrex::ReduceOpMax>
            ((ReduceData<double,double,double,double,double,double> *)&local_320,&local_599);
  iVar11 = this->m_num_tri;
  if (0 < (long)iVar11) {
    gVar32.m_value =
         ((local_320.m_tuple.
           super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
           .
           super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
         super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
         super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
         super_gpu_tuple_impl<3UL,_double,_double,_double>.super_gpu_tuple_impl<4UL,_double,_double>
         .super_gpu_tuple_impl<5UL,_double>.super_gpu_tuple_element<5UL,_double>.m_value;
    auVar4._8_8_ = ((local_320.m_tuple.
                     super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
                     .
                     super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
                   super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
                   super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
                   super_gpu_tuple_impl<3UL,_double,_double,_double>.
                   super_gpu_tuple_impl<4UL,_double,_double>.super_gpu_tuple_element<4UL,_double>.
                   m_value;
    dVar39 = ((local_320.m_tuple.
               super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
               .
               super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
             super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
             super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
             super_gpu_tuple_impl<3UL,_double,_double,_double>.super_gpu_tuple_element<3UL,_double>.
             m_value;
    dVar43 = ((local_320.m_tuple.
               super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
               .
               super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
             super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
             super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
             super_gpu_tuple_element<2UL,_double>.m_value;
    auVar36 = *(undefined1 (*) [16])
               &((local_320.m_tuple.
                  super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
                  .
                  super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
                super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
                super_gpu_tuple_element<1UL,_double>;
    lVar16 = 0;
    do {
      auVar24 = *(undefined1 (*) [16])((long)&(pTVar6->v2).y + lVar16);
      auVar60 = *(undefined1 (*) [16])((long)&(pTVar6->v1).y + lVar16);
      auVar37 = *(undefined1 (*) [16])((long)&(pTVar6->v3).y + lVar16);
      auVar34 = maxpd(auVar24,auVar60);
      auVar31 = maxpd(auVar37,auVar34);
      auVar34._8_8_ = gVar32.m_value;
      auVar34._0_8_ = auVar4._8_8_;
      auVar34 = maxpd(auVar31,auVar34);
      auVar4._8_8_ = *(double *)((long)&(pTVar6->v2).x + lVar16);
      auVar54._8_8_ = auVar4._8_8_;
      auVar54._0_8_ = auVar24._0_8_;
      dVar33 = *(double *)((long)&(pTVar6->v1).x + lVar16);
      auVar31._8_8_ = dVar33;
      auVar31._0_8_ = auVar60._0_8_;
      auVar31 = minpd(auVar54,auVar31);
      dVar27 = *(double *)((long)&(pTVar6->v3).x + lVar16);
      auVar35._8_8_ = dVar27;
      auVar35._0_8_ = auVar37._0_8_;
      auVar31 = minpd(auVar35,auVar31);
      auVar36 = minpd(auVar31,auVar36);
      *(undefined1 (*) [16])
       &((local_320.m_tuple.
          super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
          .
          super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
        super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
        super_gpu_tuple_element<1UL,_double> = auVar36;
      uVar20 = -(ulong)(auVar24._8_8_ < auVar60._8_8_);
      auVar4._8_8_ = (double)(~-(ulong)(dVar33 < auVar4._8_8_) & (ulong)dVar33 |
                             (ulong)auVar4._8_8_ & -(ulong)(dVar33 < auVar4._8_8_));
      dVar33 = (double)(~uVar20 & (ulong)auVar60._8_8_ | (ulong)auVar24._8_8_ & uVar20);
      uVar20 = -(ulong)(auVar4._8_8_ < dVar27);
      uVar21 = -(ulong)(auVar37._8_8_ < dVar33);
      auVar4._8_8_ = (double)(~uVar20 & (ulong)auVar4._8_8_ | (ulong)dVar27 & uVar20);
      dVar33 = (double)(~uVar21 & (ulong)dVar33 | (ulong)auVar37._8_8_ & uVar21);
      uVar20 = -(ulong)(dVar39 < auVar4._8_8_);
      uVar21 = -(ulong)(dVar33 < dVar43);
      dVar39 = (double)(~uVar20 & (ulong)dVar39 | (ulong)auVar4._8_8_ & uVar20);
      dVar43 = (double)(~uVar21 & (ulong)dVar43 | (ulong)dVar33 & uVar21);
      ((local_320.m_tuple.
        super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
        .
        super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
      super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
      super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
      super_gpu_tuple_impl<3UL,_double,_double,_double>.super_gpu_tuple_element<3UL,_double>.m_value
           = dVar39;
      ((local_320.m_tuple.
        super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
        .
        super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
      super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
      super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.super_gpu_tuple_element<2UL,_double>
      .m_value = dVar43;
      auVar4._8_8_ = auVar34._0_8_;
      gVar32.m_value = auVar34._8_8_;
      ((local_320.m_tuple.
        super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
        .
        super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
      super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
      super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
      super_gpu_tuple_impl<3UL,_double,_double,_double>.super_gpu_tuple_impl<4UL,_double,_double>.
      super_gpu_tuple_impl<5UL,_double>.super_gpu_tuple_element<5UL,_double> =
           (gpu_tuple_element<5UL,_double>)gVar32.m_value;
      ((local_320.m_tuple.
        super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
        .
        super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
      super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
      super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
      super_gpu_tuple_impl<3UL,_double,_double,_double>.super_gpu_tuple_impl<4UL,_double,_double>.
      super_gpu_tuple_element<4UL,_double>.m_value = auVar4._8_8_;
      lVar16 = lVar16 + 0x48;
    } while ((long)iVar11 * 0x48 != lVar16);
  }
  ReduceOps<amrex::ReduceOpMin,amrex::ReduceOpMin,amrex::ReduceOpMin,amrex::ReduceOpMax,amrex::ReduceOpMax,amrex::ReduceOpMax>
  ::value<amrex::ReduceData<double,double,double,double,double,double>>
            (&local_1e8,&local_599,&local_320);
  pXVar1 = &this->m_ptmin;
  auVar36._0_8_ =
       local_1e8.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
       super_gpu_tuple_element<0UL,_double>.m_value;
  auVar36._8_4_ =
       local_1e8.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
       super_gpu_tuple_element<1UL,_double>.m_value._0_4_;
  auVar36._12_4_ =
       local_1e8.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
       super_gpu_tuple_element<1UL,_double>.m_value._4_4_;
  (this->m_ptmin).x = (Real)auVar36._0_8_;
  (this->m_ptmin).y = (Real)auVar36._8_8_;
  d = &this->m_ptmax;
  auVar24._0_8_ =
       local_1e8.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
       super_gpu_tuple_element<2UL,_double>.m_value;
  auVar24._8_4_ =
       local_1e8.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
       super_gpu_tuple_impl<3UL,_double,_double,_double>.super_gpu_tuple_element<3UL,_double>.
       m_value._0_4_;
  auVar24._12_4_ =
       local_1e8.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
       super_gpu_tuple_impl<3UL,_double,_double,_double>.super_gpu_tuple_element<3UL,_double>.
       m_value._4_4_;
  *(undefined1 (*) [16])&(this->m_ptmin).z = auVar24;
  (this->m_ptmax).y =
       local_1e8.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
       super_gpu_tuple_impl<3UL,_double,_double,_double>.super_gpu_tuple_impl<4UL,_double,_double>.
       super_gpu_tuple_element<4UL,_double>.m_value;
  (this->m_ptmax).z =
       (Real)local_1e8.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
             super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
             super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
             super_gpu_tuple_impl<3UL,_double,_double,_double>.
             super_gpu_tuple_impl<4UL,_double,_double>.super_gpu_tuple_impl<5UL,_double>.
             super_gpu_tuple_element<5UL,_double>.m_value;
  iVar11 = Verbose();
  uVar56 = extraout_EDX;
  if (0 < iVar11) {
    local_1b8._8_8_ = OutStream();
    this_00 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
    local_1b8._0_4_ = *(int *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream(this_00);
    *(undefined8 *)((long)auStack_1a0 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"    Min: ",9);
    operator<<<amrex::XDim3,_nullptr>((ostream *)this_00,pXVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," Max: ",6);
    operator<<<amrex::XDim3,_nullptr>((ostream *)this_00,d);
    std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + (char)this_00);
    std::ostream::put((char)this_00);
    std::ostream::flush();
    Print::~Print((Print *)local_1b8);
    uVar56 = extraout_EDX_00;
  }
  pTVar7 = (this->m_tri_pts_h).m_data;
  auVar4._8_8_ = (pTVar7->v1).x;
  dVar39 = (pTVar7->v2).x;
  uVar57 = 0;
  uVar55 = 0;
  dVar43 = (pTVar7->v3).x;
  dVar33 = auVar4._8_8_ + dVar39 + dVar43;
  dVar27 = (pTVar7->v1).y;
  dVar40 = (pTVar7->v1).z;
  dVar52 = (pTVar7->v2).y;
  dVar67 = (pTVar7->v2).z;
  dVar47 = (pTVar7->v3).y;
  dVar63 = (pTVar7->v3).z;
  dVar44 = dVar52 - dVar27;
  dVar45 = dVar67 - dVar40;
  dVar27 = dVar27 + dVar52;
  dVar40 = dVar40 + dVar67;
  auVar4._8_8_ = dVar39 - auVar4._8_8_;
  dVar43 = dVar43 - dVar39;
  dVar39 = dVar44 * (dVar63 - dVar67) - (dVar47 - dVar52) * dVar45;
  dVar67 = dVar45 * dVar43 - (dVar63 - dVar67) * auVar4._8_8_;
  auVar4._8_8_ = auVar4._8_8_ * (dVar47 - dVar52) - dVar43 * dVar44;
  dVar43 = auVar4._8_8_ * auVar4._8_8_ + dVar39 * dVar39 + dVar67 * dVar67;
  if (dVar43 < 0.0) {
    local_548._8_8_ = 0;
    local_548._0_8_ = dVar33;
    local_578._8_8_ = dVar40;
    local_578._0_8_ = dVar27;
    uStack_590 = 0;
    local_598 = auVar4._8_8_;
    local_568 = dVar39;
    dStack_560 = dVar67;
    local_368 = dVar47;
    dStack_360 = dVar63;
    dVar43 = sqrt(dVar43);
    dVar33 = local_548._0_8_;
    uVar57 = local_548._8_4_;
    uVar55 = local_548._12_4_;
    auVar4._8_8_ = local_598;
    dVar39 = local_568;
    dVar67 = dStack_560;
    uVar56 = extraout_EDX_01;
    dVar47 = local_368;
    dVar63 = dStack_360;
    dVar27 = (double)local_578._0_8_;
    dVar40 = (double)local_578._8_8_;
  }
  else {
    dVar43 = SQRT(dVar43);
  }
  auVar60._0_8_ = dVar27 + dVar47;
  auVar60._8_8_ = dVar40 + dVar63;
  dVar33 = dVar33 / 3.0;
  dVar43 = 1.0 / dVar43;
  dVar39 = dVar39 * dVar43;
  dVar67 = dVar67 * dVar43;
  if (dVar39 <= 2.220446049250313e-16) {
    if (dVar39 < -2.220446049250313e-16) {
      dVar27 = pXVar1->x;
      goto LAB_0067ca66;
    }
    local_1b8._0_8_ = 1.79769313486232e+308;
  }
  else {
    dVar27 = d->x;
LAB_0067ca66:
    local_1b8._0_8_ = (dVar27 - dVar33) / dVar39;
  }
  auVar36 = divpd(auVar60,_DAT_006a3310);
  auVar4._8_8_ = auVar4._8_8_ * dVar43;
  dVar43 = auVar36._0_8_;
  if (dVar67 <= 2.220446049250313e-16) {
    if (dVar67 < -2.220446049250313e-16) {
      dVar27 = (this->m_ptmin).y;
      goto LAB_0067cab6;
    }
    local_1b8._8_8_ = (ostream *)0x7fefffffffffffff;
  }
  else {
    dVar27 = (this->m_ptmax).y;
LAB_0067cab6:
    local_1b8._8_8_ = (dVar27 - dVar43) / dVar67;
  }
  dVar27 = auVar36._8_8_;
  if (auVar4._8_8_ <= 2.220446049250313e-16) {
    if (auVar4._8_8_ < -2.220446049250313e-16) {
      dVar40 = (this->m_ptmin).z;
      goto LAB_0067caf9;
    }
    local_1b8._16_8_ = 1.79769313486232e+308;
  }
  else {
    dVar40 = (this->m_ptmax).z;
LAB_0067caf9:
    local_1b8._16_8_ = (dVar40 - dVar27) / auVar4._8_8_;
  }
  pdVar12 = (double *)local_1b8;
  lVar16 = 8;
  do {
    if (*(double *)(local_1b8 + lVar16) <= *pdVar12 && *pdVar12 != *(double *)(local_1b8 + lVar16))
    {
      pdVar12 = (double *)(local_1b8 + lVar16);
    }
    lVar16 = lVar16 + 8;
  } while (lVar16 != 0x18);
  if (dVar39 <= 2.220446049250313e-16) {
    if (dVar39 < -2.220446049250313e-16) {
      dVar40 = d->x;
      goto LAB_0067cb71;
    }
    local_1b8._0_8_ = -1.79769313486232e+308;
  }
  else {
    dVar40 = pXVar1->x;
LAB_0067cb71:
    local_1b8._0_8_ = (dVar40 - dVar33) / dVar39;
  }
  if (dVar67 <= 2.220446049250313e-16) {
    if (dVar67 < -2.220446049250313e-16) {
      dVar40 = (this->m_ptmax).y;
      goto LAB_0067cba9;
    }
    local_1b8._8_8_ = (ostream *)0xffefffffffffffff;
  }
  else {
    dVar40 = (this->m_ptmin).y;
LAB_0067cba9:
    local_1b8._8_8_ = (dVar40 - dVar43) / dVar67;
  }
  if (auVar4._8_8_ <= 2.220446049250313e-16) {
    if (-2.220446049250313e-16 <= auVar4._8_8_) {
      local_1b8._16_8_ = -1.79769313486232e+308;
      goto LAB_0067cbf6;
    }
    RVar53 = (this->m_ptmax).z;
  }
  else {
    RVar53 = (this->m_ptmin).z;
  }
  local_1b8._16_8_ = (RVar53 - dVar27) / auVar4._8_8_;
LAB_0067cbf6:
  dVar40 = *pdVar12;
  pdVar12 = (double *)local_1b8;
  lVar16 = 8;
  do {
    if (*pdVar12 <= *(double *)(local_1b8 + lVar16) && *(double *)(local_1b8 + lVar16) != *pdVar12)
    {
      pdVar12 = (double *)(local_1b8 + lVar16);
    }
    lVar16 = lVar16 + 8;
  } while (lVar16 != 0x18);
  dVar47 = -*pdVar12;
  dVar52 = dVar47;
  if (dVar47 <= dVar40) {
    dVar52 = dVar40;
  }
  if (dVar47 <= dVar40) {
    dVar52 = *pdVar12 - dVar52 * 0.009;
  }
  else {
    dVar52 = dVar40 + dVar52 * 0.009;
  }
  (this->m_ptref).x =
       dVar33 + dVar52 * (double)(~-(ulong)(ABS(dVar39) < 1e-05) & (ulong)dVar39 |
                                 ((ulong)dVar39 & 0x8000000000000000 | 0x3ee4f8b588e368f1) &
                                 -(ulong)(ABS(dVar39) < 1e-05));
  (this->m_ptref).y =
       dVar43 + dVar52 * (double)(~-(ulong)(ABS(dVar67) < 1e-05) & (ulong)dVar67 |
                                 ((ulong)dVar67 & 0x8000000000000000 | 0x3ee4f8b588e368f1) &
                                 -(ulong)(ABS(dVar67) < 1e-05));
  (this->m_ptref).z =
       (double)(~-(ulong)(ABS(auVar4._8_8_) < 1e-05) & (ulong)auVar4._8_8_ |
               ((ulong)auVar4._8_8_ & 0x8000000000000000 | 0x3ee4f8b588e368f1) &
               -(ulong)(ABS(auVar4._8_8_) < 1e-05)) * dVar52 + dVar27;
  iVar11 = this->m_num_tri;
  if ((long)iVar11 < 1) {
    bVar18 = true;
  }
  else {
    auVar4._0_8_ = (this->m_ptref).y;
    auVar4._8_8_ = (this->m_ptref).z;
    auVar25._8_8_ = -(ulong)(auVar4._8_8_ < dVar27);
    auVar25._0_8_ = -(ulong)((double)auVar4._0_8_ < dVar43);
    uVar15 = movmskpd(uVar56,auVar25);
    auVar37 = auVar36;
    if ((uVar15 & 1) == 0) {
      auVar37 = auVar4;
    }
    local_4d8 = (this->m_ptref).x;
    local_400 = dVar27;
    if ((uVar15 & 2) == 0) {
      local_400 = auVar4._8_8_;
    }
    uVar48 = CONCAT44(uVar55,uVar57);
    dVar39 = dVar33;
    if (dVar33 <= local_4d8) {
      dVar39 = local_4d8;
    }
    uVar51 = CONCAT44(uVar55,uVar57);
    dVar52 = dVar33;
    if (local_4d8 <= dVar33) {
      dVar52 = local_4d8;
    }
    local_368 = dVar43;
    if ((double)auVar4._0_8_ <= dVar43) {
      local_368 = (double)auVar4._0_8_;
    }
    local_358 = dVar27;
    if (auVar4._8_8_ <= dVar27) {
      local_358 = auVar4._8_8_;
    }
    local_278 = -(double)auVar4._0_8_;
    dStack_270 = -auVar4._8_8_;
    dVar44 = local_4d8 * dVar43 - dVar33 * (double)auVar4._0_8_;
    local_288 = -auVar4._8_8_;
    dStack_280 = -auVar4._8_8_;
    dVar67 = local_4d8 * dVar27 - dVar33 * auVar4._8_8_;
    uStack_4d0 = 0;
    local_548._8_4_ = uVar57;
    local_548._0_8_ = dVar33;
    local_548._12_4_ = uVar55;
    dVar33 = local_4d8 - dVar33;
    local_268 = (double)auVar4._0_8_ * dVar27 - dVar43 * auVar4._8_8_;
    local_258 = auVar4._8_8_ - dVar27;
    dVar63 = dVar43 - (double)auVar4._0_8_;
    dStack_240 = dVar27 - auVar4._8_8_;
    dVar43 = -dVar43;
    uStack_210 = 0;
    uStack_1f0 = 0;
    uStack_200 = 0;
    uVar56 = SUB84(dVar67,0);
    uVar57 = (undefined4)((ulong)dVar67 >> 0x20);
    lVar16 = 0;
    bVar17 = 0;
    local_2a8._8_4_ = auVar36._8_4_;
    local_2a8._0_8_ = dVar43;
    local_2a8._12_4_ = auVar36._12_4_ ^ 0x80000000;
    local_298._8_4_ = auVar36._0_4_;
    local_298._0_8_ = dVar43;
    local_298._12_4_ = (int)((ulong)dVar43 >> 0x20);
    dVar43 = dVar63;
    dVar45 = dVar44;
    dVar41 = auVar4._8_8_;
    dVar46 = dVar33;
    local_4c8 = auVar4;
    local_3c8 = dVar27;
    dStack_3c0 = dVar27;
    local_378 = auVar4._8_8_;
    dStack_370 = (double)auVar4._0_8_;
    dStack_360 = dVar27;
    local_350 = this;
    dStack_260 = local_268;
    dStack_250 = local_258;
    local_248 = dVar63;
    local_238 = local_258;
    dStack_230 = auVar4._8_8_;
    local_228 = local_268;
    dStack_220 = auVar4._8_8_;
    local_218 = dVar33;
    local_208 = dVar67;
    local_1f8 = dVar44;
    do {
      bVar18 = dVar47 <= dVar40;
      if (lVar16 != 0) {
        dVar27 = *(double *)((long)&(pTVar6->v1).x + lVar16);
        dVar23 = *(double *)((long)&(pTVar6->v2).x + lVar16);
        dVar59 = *(double *)((long)&(pTVar6->v3).x + lVar16);
        dVar2 = dVar23;
        if (dVar27 <= dVar23) {
          dVar2 = dVar27;
        }
        dVar28 = dVar59;
        if (dVar2 <= dVar59) {
          dVar28 = dVar2;
        }
        bVar18 = false;
        if (dVar28 <= dVar39) {
          pTVar7 = (pointer)&pTVar6->v2;
          if (dVar23 <= dVar27) {
            pTVar7 = pTVar6;
          }
          pdVar12 = (double *)((long)&(pTVar7->v1).x + lVar16);
          if (*pdVar12 <= dVar59 && dVar59 != *pdVar12) {
            pdVar12 = (double *)((long)&(pTVar6->v3).x + lVar16);
          }
          if (dVar52 < *pdVar12 || dVar52 == *pdVar12) {
            dStack_560 = 0.0;
            uStack_590 = 0;
            dVar2 = *(double *)((long)&(pTVar6->v1).y + lVar16);
            dVar28 = *(double *)((long)&(pTVar6->v2).y + lVar16);
            dVar62 = *(double *)((long)&(pTVar6->v3).y + lVar16);
            dVar22 = dVar28;
            if (dVar2 <= dVar28) {
              dVar22 = dVar2;
            }
            dVar29 = dVar62;
            if (dVar22 <= dVar62) {
              dVar29 = dVar22;
            }
            local_598 = dVar27;
            local_568 = dVar23;
            if (dVar29 <= auVar37._0_8_) {
              pXVar1 = &pTVar6->v2;
              if (dVar28 <= dVar2) {
                pXVar1 = &pTVar6->v1;
              }
              pdVar12 = (double *)((long)&pXVar1->y + lVar16);
              if (*pdVar12 <= dVar62 && dVar62 != *pdVar12) {
                pdVar12 = (double *)((long)&(pTVar6->v3).y + lVar16);
              }
              if (local_368 < *pdVar12 || local_368 == *pdVar12) {
                uStack_3b0 = 0;
                dStack_4b0 = 0.0;
                dVar22 = *(double *)((long)&(pTVar6->v1).z + lVar16);
                dVar29 = *(double *)((long)&(pTVar6->v2).z + lVar16);
                dVar3 = *(double *)((long)&(pTVar6->v3).z + lVar16);
                dVar50 = dVar29;
                if (dVar22 <= dVar29) {
                  dVar50 = dVar22;
                }
                dVar30 = dVar3;
                if (dVar50 <= dVar3) {
                  dVar30 = dVar50;
                }
                local_4b8 = dVar59;
                local_3b8 = dVar62;
                if (dVar30 <= local_400) {
                  pXVar1 = &pTVar6->v2;
                  if (dVar29 <= dVar22) {
                    pXVar1 = &pTVar6->v1;
                  }
                  pdVar14 = (double *)((long)&pXVar1->z + lVar16);
                  pdVar12 = (double *)((long)&(pTVar6->v3).z + lVar16);
                  if (*pdVar14 <= dVar3 && dVar3 != *pdVar14) {
                    pdVar14 = pdVar12;
                  }
                  if (local_358 < *pdVar14 || local_358 == *pdVar14) {
                    local_4f8._8_4_ = uVar56;
                    local_4f8._0_8_ = dVar67;
                    local_4f8._12_4_ = uVar57;
                    local_3e8 = dVar27 - dVar23;
                    dStack_3e0 = dVar23 - dVar59;
                    uStack_420 = 0;
                    dVar50 = dVar29 - dVar3;
                    uStack_440 = 0;
                    local_508 = dVar28 - dVar2;
                    local_518._8_8_ = dVar62 - dVar28;
                    local_518._0_8_ = local_508;
                    dVar68 = dVar59 * dVar2 - dVar27 * dVar62;
                    uStack_500 = 0;
                    local_4a8 = dVar59 * dVar22 - dVar27 * dVar3;
                    uStack_4a0 = 0;
                    dVar30 = dVar62 * dVar22 - dVar2 * dVar3;
                    uStack_430 = 0;
                    uStack_520 = 0;
                    dVar65 = dVar3 - dVar22;
                    local_538._8_8_ = 0;
                    local_538._0_8_ = dVar2;
                    local_3d8 = dVar2 - dVar62;
                    local_4b8 = dVar27 * dVar28 - dVar23 * dVar2;
                    dVar42 = dVar23 * dVar62 - dVar59 * dVar28;
                    dVar49 = dVar23 * dVar3 - dVar59 * dVar29;
                    dVar38 = dVar3 * dVar28 - dVar62 * dVar29;
                    local_458._8_4_ = SUB84(dVar50,0);
                    local_458._0_8_ = dVar22 - dVar29;
                    local_458._12_4_ = (int)((ulong)dVar50 >> 0x20);
                    dVar58 = dVar63 * (dVar27 * dVar29 - dVar23 * dVar22) +
                             local_258 * local_4b8 +
                             local_268 * local_3e8 +
                             dVar33 * (dVar29 * dVar2 - dVar28 * dVar22) +
                             dVar44 * (dVar22 - dVar29) + dVar67 * local_508;
                    dVar61 = dVar43 * dVar49 +
                             dStack_250 * dVar42 +
                             dStack_260 * dStack_3e0 +
                             dVar46 * dVar38 +
                             dVar45 * dVar50 + (double)local_4f8._8_8_ * (double)local_518._8_8_;
                    uStack_3d0 = 0;
                    dVar50 = dVar59 - dVar27;
                    dVar66 = local_248 * local_4a8 +
                             local_238 * dVar68 +
                             local_228 * dVar50 +
                             local_218 * dVar30 + local_1f8 * dVar65 + local_208 * local_3d8;
                    auVar9._8_8_ = -(ulong)(ABS(dVar61) < 2.220446049250313e-16);
                    auVar9._0_8_ = -(ulong)(ABS(dVar58) < 2.220446049250313e-16);
                    uVar15 = movmskpd((int)pdVar12,auVar9);
                    dVar64 = ABS(dVar66);
                    bVar10 = (byte)uVar15;
                    local_580 = auVar37._0_8_;
                    local_578 = auVar36;
                    local_558 = auVar4._8_8_;
                    dStack_550 = dVar41;
                    local_528 = dVar22;
                    local_4e8 = dVar33;
                    dStack_4e0 = dVar46;
                    local_498 = dVar63;
                    dStack_490 = dVar43;
                    local_488 = dVar52;
                    uStack_480 = uVar51;
                    local_478 = dVar39;
                    uStack_470 = uVar48;
                    local_468 = dVar44;
                    dStack_460 = dVar45;
                    local_448 = dVar28;
                    local_438 = dVar3;
                    local_428 = dVar29;
                    if ((((uVar15 & 1) == 0) ||
                        (pdVar14 = (double *)(ulong)CONCAT31((int3)(uVar15 >> 8),bVar10 >> 1),
                        bVar10 >> 1 == 0)) || (2.220446049250313e-16 <= dVar64)) {
                      dVar59 = auVar36._0_8_;
                      dVar62 = auVar36._8_8_;
                      local_508 = dVar68;
                      dStack_4b0 = dVar42;
                      local_3f8 = dVar22;
                      dStack_3f0 = dVar29;
                      if (((0.0 <= dVar66) || (0.0 <= dVar58)) || (0.0 <= dVar61)) {
                        auVar26._8_8_ = -(ulong)(0.0 < dVar61);
                        auVar26._0_8_ = -(ulong)(0.0 < dVar58);
                        iVar13 = movmskpd((int)pdVar14,auVar26);
                        if ((((0.0 < dVar66) && (iVar13 == 3)) ||
                            (((bVar10 & 0.0 < dVar61 * dVar66) != 0 ||
                             ((ABS(dVar61) < 2.220446049250313e-16 && (0.0 < dVar66 * dVar58))))))
                           || ((dVar64 < 2.220446049250313e-16 && (0.0 < dVar61 * dVar58))))
                        goto LAB_0067d556;
                        if ((2.220446049250313e-16 <= ABS(dVar61)) ||
                           (2.220446049250313e-16 <= dVar64 && (uVar15 & 1) == 0)) {
                          if ((~bVar10 & 1) != 0 || 2.220446049250313e-16 <= dVar64) {
                            auVar37._8_8_ = 0;
                            goto LAB_0067ddbd;
                          }
                          dVar27 = (local_3d8 * ((double)local_548._0_8_ * dVar29 - dVar23 * dVar62)
                                   + dVar65 * ((double)local_548._0_8_ * dVar28 +
                                              (double)local_298._8_8_ * dVar23) +
                                     dVar30 * ((double)local_548._0_8_ - dVar23) +
                                     dVar50 * (dVar59 * dVar29 - dVar28 * dVar62) +
                                     dVar68 * (dVar62 - dVar29) + local_4a8 * (dVar28 - dVar59)) *
                                   (local_3d8 * (dVar23 * local_378 - local_4d8 * dVar29) +
                                   dVar65 * (dVar23 * (double)local_4c8._0_8_ + -dVar28 * local_4d8)
                                   + dVar30 * (dVar23 - local_4d8) +
                                     dVar50 * (dVar28 * local_378 - (double)local_4c8._0_8_ * dVar29
                                              ) +
                                     dVar68 * (dVar29 - local_378) +
                                     local_4a8 * ((double)local_4c8._0_8_ - dVar28));
                        }
                        else {
                          dVar27 = ((double)local_518._8_8_ *
                                    ((double)local_548._0_8_ * dVar22 - dVar27 * dVar62) +
                                   (double)local_458._8_8_ *
                                   ((double)local_548._0_8_ * dVar2 +
                                   (double)local_2a8._0_8_ * dVar27) +
                                   dVar38 * ((double)local_548._0_8_ - dVar27) +
                                   dStack_3e0 * (dVar59 * dVar22 - dVar2 * dVar62) +
                                   dVar42 * (dVar62 - dVar22) + dVar49 * (dVar2 - dVar59)) *
                                   ((double)local_518._8_8_ *
                                    (dVar27 * local_378 - local_4d8 * dVar22) +
                                   (double)local_458._8_8_ *
                                   (dVar27 * (double)local_4c8._0_8_ + -dVar2 * local_4d8) +
                                   dVar38 * (dVar27 - local_4d8) +
                                   dStack_3e0 *
                                   (dVar2 * local_378 - (double)local_4c8._0_8_ * dVar22) +
                                   dVar42 * (dVar22 - local_378) +
                                   dVar49 * ((double)local_4c8._0_8_ - dVar2));
                        }
                      }
                      else {
LAB_0067d556:
                        dVar27 = ((double)local_518._8_8_ *
                                  (local_4d8 * dVar22 + dVar27 * local_288) +
                                 (double)local_458._8_8_ * (local_4d8 * dVar2 + local_278 * dVar27)
                                 + dVar38 * (local_4d8 - dVar27) +
                                   dStack_3e0 * (dStack_370 * dVar22 + local_288 * dVar2) +
                                   dVar42 * ((double)local_4c8._8_8_ - dVar22) +
                                   dVar49 * (dVar2 - dStack_370)) *
                                 ((double)local_518._8_8_ *
                                  (dVar27 * dVar62 + (double)local_548._0_8_ * -dVar22) +
                                 (double)local_458._8_8_ *
                                 (dVar27 * dVar59 + -dVar2 * (double)local_548._0_8_) +
                                 dVar38 * (dVar27 - (double)local_548._0_8_) +
                                 dStack_3e0 * (dVar2 * dVar62 + -dVar22 * dVar59) +
                                 dVar42 * (dVar22 - dVar62) + dVar49 * (dVar59 - dVar2));
                      }
                      auVar37._8_8_ = 0;
                      if (dVar27 <= 0.0) goto LAB_0067ddbd;
                    }
                    else {
                      dVar23 = dVar23 - dVar27;
                      local_4a8 = dVar29 - dVar22;
                      dVar39 = local_508 * dVar65 - (dVar62 - dVar2) * local_4a8;
                      dVar43 = local_4a8 * dVar50 - dVar65 * dVar23;
                      uStack_4a0 = 0;
                      local_3e8 = -local_4a8;
                      dStack_3e0 = -0.0;
                      auVar4._8_8_ = (dVar62 - dVar2) * dVar23 - dVar50 * local_508;
                      local_458._8_8_ = 0x8000000000000000;
                      local_458._0_8_ = -dVar23;
                      auVar4._8_8_ = auVar4._8_8_ * auVar4._8_8_ + dVar39 * dVar39 + dVar43 * dVar43
                      ;
                      local_3f8 = -local_508;
                      dStack_3f0 = -(double)local_518._8_8_;
                      local_388._8_8_ = 0;
                      local_388._0_8_ = dVar23;
                      if (auVar4._8_8_ < 0.0) {
                        local_4b8 = dVar59;
                        auVar4._8_8_ = sqrt(auVar4._8_8_);
                        uVar56 = local_538._0_4_;
                        uVar57 = local_538._4_4_;
                        dVar23 = (double)local_388._0_8_;
                      }
                      else {
                        auVar4._8_8_ = SQRT(auVar4._8_8_);
                        uVar56 = SUB84(dVar2,0);
                        uVar57 = (int)((ulong)dVar2 >> 0x20);
                        local_4b8 = dVar59;
                      }
                      dVar39 = (double)local_4c8._0_8_ - (double)CONCAT44(uVar57,uVar56);
                      dVar33 = local_508 * (local_558 - local_528) + dVar39 * local_3e8;
                      dVar43 = local_4a8 * (local_4d8 - local_598) +
                               (local_558 - local_528) * (double)local_458._0_8_;
                      dVar39 = (local_4d8 - local_598) * local_3f8 + dVar23 * dVar39;
                      dVar39 = dVar39 * dVar39 + dVar33 * dVar33 + dVar43 * dVar43;
                      local_408 = auVar4._8_8_ * 0.5;
                      if (dVar39 < 0.0) {
                        dVar39 = sqrt(dVar39);
                        uVar56 = (undefined4)extraout_XMM0_Qb;
                        uVar57 = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
                      }
                      else {
                        uVar56 = 0;
                        uVar57 = 0;
                        dVar39 = SQRT(dVar39);
                      }
                      local_398 = local_4b8 - local_568;
                      local_338 = local_438 - local_428;
                      dVar33 = (double)local_518._8_8_ * (local_558 - local_428) -
                               ((double)local_4c8._0_8_ - local_448) * local_338;
                      uStack_330 = uStack_430;
                      dVar43 = local_338 * (local_4d8 - local_568) -
                               (local_558 - local_428) * local_398;
                      auVar8._8_4_ = (int)local_518._8_8_;
                      auVar8._0_8_ = local_518._8_8_;
                      auVar8._12_4_ = SUB84(local_518._8_8_,4);
                      auVar4._8_8_ = local_398 * ((double)local_4c8._0_8_ - local_448) -
                                     (local_4d8 - local_568) * (double)local_518._8_8_;
                      auVar4._8_8_ = auVar4._8_8_ * auVar4._8_8_ + dVar33 * dVar33 + dVar43 * dVar43
                      ;
                      dStack_390 = dStack_4b0;
                      local_2b8._8_4_ = uVar56;
                      local_2b8._0_8_ = dVar39 * 0.5;
                      local_2b8._12_4_ = uVar57;
                      local_518 = auVar8;
                      if (auVar4._8_8_ < 0.0) {
                        auVar4._8_8_ = sqrt(auVar4._8_8_);
                        dVar39 = (double)local_4c8._0_8_;
                      }
                      else {
                        auVar4._8_8_ = SQRT(auVar4._8_8_);
                        dVar39 = (double)local_4c8._0_8_;
                      }
                      uVar56 = (undefined4)uStack_590;
                      uVar15 = (uint)((ulong)uStack_590 >> 0x20);
                      dVar43 = local_598 - local_4b8;
                      local_348 = local_528 - local_438;
                      dVar27 = local_3d8 * (local_558 - local_438) -
                               (dVar39 - local_3b8) * local_348;
                      uStack_340 = uStack_520;
                      dVar33 = local_348 * (local_4d8 - local_4b8) -
                               (local_558 - local_438) * dVar43;
                      dVar39 = dVar43 * (dVar39 - local_3b8) - (local_4d8 - local_4b8) * local_3d8;
                      local_2c8 = -local_338;
                      uStack_2c0 = uStack_330 ^ 0x8000000000000000;
                      local_2d8 = -local_398;
                      dStack_2d0 = -dStack_390;
                      dVar39 = dVar39 * dVar39 + dVar27 * dVar27 + dVar33 * dVar33;
                      local_2e8 = -(double)local_518._0_8_;
                      uStack_2e0 = local_518._8_8_ ^ 0x8000000000000000;
                      local_410 = auVar4._8_8_ * 0.5;
                      local_3a8._8_4_ = uVar56;
                      local_3a8._0_8_ = dVar43;
                      local_3a8._12_4_ = uVar15;
                      if (dVar39 < 0.0) {
                        dVar39 = sqrt(dVar39);
                        dVar43 = local_3a8._0_8_;
                        uVar56 = local_3a8._8_4_;
                        uVar15 = local_3a8._12_4_;
                      }
                      else {
                        dVar39 = SQRT(dVar39);
                      }
                      auVar4._8_8_ = local_578._0_8_ - (double)local_538._0_8_;
                      dVar27 = local_508 * (local_3c8 - local_528) + local_3e8 * auVar4._8_8_;
                      dVar33 = local_4a8 * ((double)local_548._0_8_ - local_598) +
                               (local_3c8 - local_528) * (double)local_458._0_8_;
                      auVar4._8_8_ = (double)local_388._0_8_ * auVar4._8_8_ +
                                     ((double)local_548._0_8_ - local_598) * local_3f8;
                      local_528 = -local_348;
                      uStack_520 = uStack_340 ^ 0x8000000000000000;
                      local_538._8_4_ = uVar56;
                      local_538._0_8_ = -dVar43;
                      local_538._12_4_ = uVar15 ^ 0x80000000;
                      auVar4._8_8_ = auVar4._8_8_ * auVar4._8_8_ + dVar27 * dVar27 + dVar33 * dVar33
                      ;
                      local_4a8 = -local_3d8;
                      uStack_4a0 = uStack_3d0 ^ 0x8000000000000000;
                      local_598 = dVar39 * 0.5;
                      if (auVar4._8_8_ < 0.0) {
                        local_508 = sqrt(auVar4._8_8_);
                        uStack_500 = extraout_XMM0_Qb_00;
                      }
                      else {
                        local_508 = SQRT(auVar4._8_8_);
                        uStack_500 = 0;
                      }
                      auVar4._8_8_ = local_578._0_8_ - local_448;
                      dVar39 = (double)local_518._0_8_ * (local_3c8 - local_428) +
                               local_2c8 * auVar4._8_8_;
                      dVar43 = local_338 * ((double)local_548._0_8_ - local_568) +
                               (local_3c8 - local_428) * local_2d8;
                      auVar4._8_8_ = local_398 * auVar4._8_8_ +
                                     ((double)local_548._0_8_ - local_568) * local_2e8;
                      dVar27 = auVar4._8_8_ * auVar4._8_8_ + dVar39 * dVar39 + dVar43 * dVar43;
                      if (dVar27 < 0.0) {
                        dVar27 = sqrt(dVar27);
                        auVar4._8_8_ = (double)local_548._0_8_;
                      }
                      else {
                        dVar27 = SQRT(dVar27);
                        auVar4._8_8_ = (double)local_548._0_8_;
                      }
                      dVar39 = local_578._0_8_ - local_3b8;
                      dVar43 = local_3d8 * (local_3c8 - local_438) + local_528 * dVar39;
                      dVar33 = local_348 * (auVar4._8_8_ - local_4b8) +
                               (local_3c8 - local_438) * (double)local_538._0_8_;
                      auVar4._8_8_ = (double)local_3a8._0_8_ * dVar39 +
                                     (auVar4._8_8_ - local_4b8) * local_4a8;
                      dVar23 = auVar4._8_8_ * auVar4._8_8_ + dVar43 * dVar43 + dVar33 * dVar33;
                      if (dVar23 < 0.0) {
                        local_568 = dVar27;
                        dVar23 = sqrt(dVar23);
                        dVar27 = local_568;
                      }
                      else {
                        dVar23 = SQRT(dVar23);
                      }
                      auVar37._8_8_ = 0;
                      auVar37._0_8_ = local_580;
                      dVar67 = local_4f8._0_8_;
                      uVar56 = local_4f8._8_4_;
                      uVar57 = local_4f8._12_4_;
                      if ((ABS(((double)local_2b8._0_8_ + local_410 + local_598) - local_408) <=
                           2.220446049250313e-16) &&
                         (auVar36 = local_578, dVar63 = local_498, dVar43 = dStack_490,
                         dVar44 = local_468, dVar45 = dStack_460, auVar4._8_8_ = local_558,
                         dVar41 = dStack_550, dVar33 = local_4e8, dVar46 = dStack_4e0,
                         dVar39 = local_478, uVar48 = uStack_470, dVar52 = local_488,
                         uVar51 = uStack_480,
                         ABS((local_508 * 0.5 + dVar27 * 0.5 + dVar23 * 0.5) - local_408) <=
                         2.220446049250313e-16)) goto LAB_0067ddbd;
                    }
                    bVar18 = true;
                    auVar36 = local_578;
                    dVar63 = local_498;
                    dVar43 = dStack_490;
                    dVar44 = local_468;
                    dVar45 = dStack_460;
                    auVar4._8_8_ = local_558;
                    dVar41 = dStack_550;
                    dVar33 = local_4e8;
                    dVar46 = dStack_4e0;
                    dVar39 = local_478;
                    uVar48 = uStack_470;
                    dVar52 = local_488;
                    uVar51 = uStack_480;
                  }
                }
              }
            }
          }
        }
      }
LAB_0067ddbd:
      bVar17 = bVar17 + bVar18;
      lVar16 = lVar16 + 0x48;
    } while ((long)iVar11 * 0x48 != lVar16);
    bVar18 = (bool)(~bVar17 & 1);
    this = local_350;
  }
  this->m_boundry_is_outside = bVar18;
  if (local_320.m_fn_value.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_320.m_fn_value.super__Function_base._M_manager)
              ((_Any_data *)&local_320.m_fn_value,(_Any_data *)&local_320.m_fn_value,
               __destroy_functor);
  }
  if (local_320.m_tuple.
      super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
      .
      super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_320.m_tuple.
                    super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
                    .
                    super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_320.m_tuple.
                          super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
                          .
                          super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_320.m_tuple.
                          super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
                          .
                          super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
STLtools::prepare ()
{
    ParallelDescriptor::Bcast(&m_num_tri, 1);
    if (!ParallelDescriptor::IOProcessor()) {
        m_tri_pts_h.resize(m_num_tri);
    }

    //device vectors
    m_tri_pts_d.resize(m_num_tri);
    m_tri_normals_d.resize(m_num_tri);

    Gpu::copyAsync(Gpu::hostToDevice, m_tri_pts_h.begin(), m_tri_pts_h.end(),
                   m_tri_pts_d.begin());

    Triangle const* tri_pts = m_tri_pts_d.data();
    XDim3* tri_norm = m_tri_normals_d.data();

    // Compute normals in case the STL file does not have valid data for normals
    ParallelFor(m_num_tri, [=] AMREX_GPU_DEVICE (int i) noexcept
    {
        Triangle const& tri = tri_pts[i];
        XDim3 vec1{tri.v2.x-tri.v1.x, tri.v2.y-tri.v1.y, tri.v2.z-tri.v1.z};
        XDim3 vec2{tri.v3.x-tri.v2.x, tri.v3.y-tri.v2.y, tri.v3.z-tri.v2.z};
        XDim3 norm{vec1.y*vec2.z-vec1.z*vec2.y,
                   vec1.z*vec2.x-vec1.x*vec2.z,
                   vec1.x*vec2.y-vec1.y*vec2.x};
        Real tmp = 1._rt / std::sqrt(norm.x*norm.x + norm.y*norm.y + norm.z*norm.z);
        tri_norm[i].x = norm.x * tmp;
        tri_norm[i].y = norm.y * tmp;
        tri_norm[i].z = norm.z * tmp;
    });

    ReduceOps<ReduceOpMin,ReduceOpMin,ReduceOpMin,ReduceOpMax,ReduceOpMax,ReduceOpMax> reduce_op;
    ReduceData<Real,Real,Real,Real,Real,Real> reduce_data(reduce_op);
    using ReduceTuple = typename decltype(reduce_data)::Type;
    reduce_op.eval(m_num_tri, reduce_data,
                   [=] AMREX_GPU_DEVICE (int i) -> ReduceTuple
                   {
                       return {amrex::min(tri_pts[i].v1.x,
                                          tri_pts[i].v2.x,
                                          tri_pts[i].v3.x),
                               amrex::min(tri_pts[i].v1.y,
                                          tri_pts[i].v2.y,
                                          tri_pts[i].v3.y),
                               amrex::min(tri_pts[i].v1.z,
                                          tri_pts[i].v2.z,
                                          tri_pts[i].v3.z),
                               amrex::max(tri_pts[i].v1.x,
                                          tri_pts[i].v2.x,
                                          tri_pts[i].v3.x),
                               amrex::max(tri_pts[i].v1.y,
                                          tri_pts[i].v2.y,
                                          tri_pts[i].v3.y),
                               amrex::max(tri_pts[i].v1.z,
                                          tri_pts[i].v2.z,
                                          tri_pts[i].v3.z)};
                   });
    auto const& hv = reduce_data.value(reduce_op);
    m_ptmin.x = amrex::get<0>(hv);
    m_ptmin.y = amrex::get<1>(hv);
    m_ptmin.z = amrex::get<2>(hv);
    m_ptmax.x = amrex::get<3>(hv);
    m_ptmax.y = amrex::get<4>(hv);
    m_ptmax.z = amrex::get<5>(hv);

    if (amrex::Verbose() > 0) {
        amrex::Print() << "    Min: " << m_ptmin << " Max: " << m_ptmax << std::endl;
    }

    // Choose a reference point by extending the normal vector of the first
    // triangle until it's slightly outside the bounding box.
    XDim3 cent0; // centroid of the first triangle
    int is_ref_positive;
    {
        Triangle const& tri = m_tri_pts_h[0];
        cent0 = XDim3{(tri.v1.x + tri.v2.x + tri.v3.x) / 3._rt,
                      (tri.v1.y + tri.v2.y + tri.v3.y) / 3._rt,
                      (tri.v1.z + tri.v2.z + tri.v3.z) / 3._rt};
        // We are computing the normal ourselves in case the stl file does
        // not have valid data on normal.
        XDim3 vec1{tri.v2.x-tri.v1.x, tri.v2.y-tri.v1.y, tri.v2.z-tri.v1.z};
        XDim3 vec2{tri.v3.x-tri.v2.x, tri.v3.y-tri.v2.y, tri.v3.z-tri.v2.z};
        XDim3 norm{vec1.y*vec2.z-vec1.z*vec2.y,
                   vec1.z*vec2.x-vec1.x*vec2.z,
                   vec1.x*vec2.y-vec1.y*vec2.x};
        Real tmp = 1._rt / std::sqrt(norm.x*norm.x + norm.y*norm.y + norm.z*norm.z);
        norm.x *= tmp;
        norm.y *= tmp;
        norm.z *= tmp;
        // Now we need to find out where the normal vector will intersect
        // with the bounding box defined by m_ptmin and m_ptmax.
        Real Lx, Ly, Lz;
        constexpr Real eps = std::numeric_limits<Real>::epsilon();
        if (norm.x > eps) {
            Lx = (m_ptmax.x-cent0.x) / norm.x;
        } else if (norm.x < -eps) {
            Lx = (m_ptmin.x-cent0.x) / norm.x;
        } else {
            Lx = std::numeric_limits<Real>::max();
        }
        if (norm.y > eps) {
            Ly = (m_ptmax.y-cent0.y) / norm.y;
        } else if (norm.y < -eps) {
            Ly = (m_ptmin.y-cent0.y) / norm.y;
        } else {
            Ly = std::numeric_limits<Real>::max();
        }
        if (norm.z > eps) {
            Lz = (m_ptmax.z-cent0.z) / norm.z;
        } else if (norm.z < -eps) {
            Lz = (m_ptmin.z-cent0.z) / norm.z;
        } else {
            Lz = std::numeric_limits<Real>::max();
        }
        Real Lp = std::min({Lx,Ly,Lz});
        if (norm.x > eps) {
            Lx = (m_ptmin.x-cent0.x) / norm.x;
        } else if (norm.x < -eps) {
            Lx = (m_ptmax.x-cent0.x) / norm.x;
        } else {
            Lx = std::numeric_limits<Real>::lowest();
        }
        if (norm.y > eps) {
            Ly = (m_ptmin.y-cent0.y) / norm.y;
        } else if (norm.y < -eps) {
            Ly = (m_ptmax.y-cent0.y) / norm.y;
        } else {
            Ly = std::numeric_limits<Real>::lowest();
        }
        if (norm.z > eps) {
            Lz = (m_ptmin.z-cent0.z) / norm.z;
        } else if (norm.z < -eps) {
            Lz = (m_ptmax.z-cent0.z) / norm.z;
        } else {
            Lz = std::numeric_limits<Real>::lowest();
        }
        if (std::abs(norm.x) < 1.e-5) {
            norm.x = std::copysign(1.e-5, norm.x);
        }
        if (std::abs(norm.y) < 1.e-5) {
            norm.y = std::copysign(1.e-5, norm.y);
        }
        if (std::abs(norm.z) < 1.e-5) {
            norm.z = std::copysign(1.e-5, norm.z);
        }
        Real Lm = std::max({Lx,Ly,Lz});
        Real Leps = std::max(Lp,-Lm) * 0.009;
        if (Lp < -Lm) {
            m_ptref.x = cent0.x + (Lp+Leps) * norm.x;
            m_ptref.y = cent0.y + (Lp+Leps) * norm.y;
            m_ptref.z = cent0.z + (Lp+Leps) * norm.z;
            is_ref_positive = true;
        } else {
            m_ptref.x = cent0.x + (Lm-Leps) * norm.x;
            m_ptref.y = cent0.y + (Lm-Leps) * norm.y;
            m_ptref.z = cent0.z + (Lm-Leps) * norm.z;
            is_ref_positive = false;
        }
    }

    // We now need to figure out if the boundary and the reference is
    // outside or inside the object.
    XDim3 ptref = m_ptref;
    int num_isects = Reduce::Sum<int>(m_num_tri, [=] AMREX_GPU_DEVICE (int i) -> int
        {
            if (i == 0) {
                return 1-is_ref_positive;
            } else {
                Real p1[] = {ptref.x, ptref.y, ptref.z};
                Real p2[] = {cent0.x, cent0.y, cent0.z};
                return static_cast<int>(line_tri_intersects(p1, p2, tri_pts[i]));
            }
        });

    m_boundry_is_outside = num_isects % 2 == 0;
}